

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANTLRException.hpp
# Opt level: O0

void __thiscall antlr::ANTLRException::ANTLRException(ANTLRException *this,ANTLRException *param_2)

{
  long in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__ANTLRException_00505dd0;
  std::__cxx11::string::string((string *)(in_RDI + 1),(string *)(in_RSI + 8));
  return;
}

Assistant:

class ANTLR_API ANTLRException
{
public:
	/// Create ANTLR base exception without error message
	ANTLRException() : text("")
	{
	}
	/// Create ANTLR base exception with error message
	ANTLRException(const ANTLR_USE_NAMESPACE(std)string& s)
	: text(s)
	{
	}
	virtual ~ANTLRException() throw()
	{
	}

	/** Return complete error message with line/column number info (if present)
	 * @note for your own exceptions override this one. Call getMessage from
	 * here to get the 'clean' error message stored in the text attribute.
	 */
	virtual ANTLR_USE_NAMESPACE(std)string toString() const
	{
		return text;
	}

	/** Return error message without additional info (if present)
	 * @note when making your own exceptions classes override toString
	 * and call in toString getMessage which relays the text attribute
	 * from here.
	 */
	virtual ANTLR_USE_NAMESPACE(std)string getMessage() const
	{
		return text;
	}
private:
	ANTLR_USE_NAMESPACE(std)string text;
}